

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D_adapt.c
# Opt level: O3

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  lVar3 = *user_data;
  lVar4 = *(long *)((long)user_data + 8);
  dVar2 = *(double *)((long)user_data + 0x10);
  lVar5 = N_VGetArrayPointer();
  if ((lVar5 == 0) || (lVar6 = N_VGetArrayPointer(ydot), lVar6 == 0)) {
    f_cold_1();
    iVar8 = 1;
  }
  else {
    N_VConst(0,ydot);
    iVar8 = 0;
    if (2 < lVar3) {
      iVar8 = 0;
      lVar7 = 0;
      do {
        dVar9 = *(double *)(lVar5 + 8 + lVar7 * 8) * dVar2;
        pdVar1 = (double *)(lVar4 + 8 + lVar7 * 8);
        dVar10 = *pdVar1;
        dVar12 = dVar10 - *(double *)(lVar4 + lVar7 * 8);
        dVar13 = pdVar1[1] - dVar10;
        dVar14 = *(double *)(lVar5 + lVar7 * 8) * dVar2;
        dVar17 = *(double *)(lVar5 + 0x10 + lVar7 * 8) * dVar2;
        auVar15._0_8_ = dVar14 + dVar14;
        auVar15._8_8_ = dVar17 + dVar17;
        auVar16._8_8_ = (dVar12 + dVar13) * dVar13;
        auVar16._0_8_ = (dVar12 + dVar13) * dVar12;
        auVar16 = divpd(auVar15,auVar16);
        dVar10 = exp((dVar10 + -0.25) * -200.0 * (dVar10 + -0.25));
        dVar14 = *(double *)(lVar4 + 8 + lVar7 * 8) + -0.7;
        dVar14 = exp(dVar14 * -400.0 * dVar14);
        dVar17 = *(double *)(lVar4 + 8 + lVar7 * 8) + -0.4;
        dVar17 = exp(dVar17 * -500.0 * dVar17);
        dVar11 = *(double *)(lVar4 + 8 + lVar7 * 8) + -0.55;
        dVar11 = exp(dVar11 * -600.0 * dVar11);
        *(double *)(lVar6 + 8 + lVar7 * 8) =
             (dVar17 + ((dVar10 + dVar10 +
                        auVar16._8_8_ + (auVar16._0_8_ - (dVar9 + dVar9) / (dVar13 * dVar12))) -
                       dVar14)) - (dVar11 + dVar11);
        lVar7 = lVar7 + 1;
      } while (lVar3 + -2 != lVar7);
    }
  }
  return iVar8;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata = (UserData)user_data; /* access problem data */
  sunindextype N = udata->N;            /* set variable shortcuts */
  sunrealtype k  = udata->k;
  sunrealtype* x = udata->x;
  sunrealtype *Y = NULL, *Ydot = NULL;
  sunrealtype dxL, dxR;
  sunindextype i;

  /* access data arrays */
  Y = N_VGetArrayPointer(y);
  if (check_flag((void*)Y, "N_VGetArrayPointer", 0)) { return 1; }
  Ydot = N_VGetArrayPointer(ydot);
  if (check_flag((void*)Ydot, "N_VGetArrayPointer", 0)) { return 1; }

  /* Initialize ydot to zero - also handles boundary conditions */
  N_VConst(ZERO, ydot);

  /* iterate over domain interior, computing all equations */
  for (i = 1; i < N - 1; i++)
  { /* interior */
    dxL = x[i] - x[i - 1];
    dxR = x[i + 1] - x[i];
    Ydot[i] =
      Y[i - 1] * k * TWO / (dxL * (dxL + dxR)) - Y[i] * k * TWO / (dxL * dxR) +
      Y[i + 1] * k * TWO / (dxR * (dxL + dxR)) +
      TWO * exp(-TWOHUNDRED * (x[i] - PT25) * (x[i] - PT25)) /* source term */
      - exp(-FOURHUNDRED * (x[i] - PT7) * (x[i] - PT7)) +
      exp(-FIVEHUNDRED * (x[i] - PT4) * (x[i] - PT4)) -
      TWO * exp(-SIXHUNDRED * (x[i] - PT55) * (x[i] - PT55));
  }

  return 0; /* Return with success */
}